

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

void __thiscall icu_63::UnicodeSet::~UnicodeSet(UnicodeSet *this)

{
  UnicodeSetStringSpan *this_00;
  void *in_RSI;
  UnicodeSet *this_local;
  
  uprv_free_63(this->list);
  if (this->bmpSet != (BMPSet *)0x0) {
    (*this->bmpSet->_vptr_BMPSet[1])();
  }
  if (this->buffer != (UChar32 *)0x0) {
    uprv_free_63(this->buffer);
  }
  if (this->strings != (UVector *)0x0) {
    (*(this->strings->super_UObject)._vptr_UObject[1])();
  }
  this_00 = this->stringSpan;
  if (this_00 != (UnicodeSetStringSpan *)0x0) {
    UnicodeSetStringSpan::~UnicodeSetStringSpan(this_00);
    UMemory::operator_delete((UMemory *)this_00,in_RSI);
  }
  releasePattern(this);
  UnicodeFilter::~UnicodeFilter(&this->super_UnicodeFilter);
  return;
}

Assistant:

UnicodeSet::~UnicodeSet() {
    _dbgdt(this); // first!
    uprv_free(list);
    delete bmpSet;
    if (buffer) {
        uprv_free(buffer);
    }
    delete strings;
    delete stringSpan;
    releasePattern();
}